

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall
Json::BuiltStyledStreamWriter::isMultilineArray(BuiltStyledStreamWriter *this,Value *value)

{
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  _Var1;
  byte bVar2;
  bool bVar3;
  ArrayIndex AVar4;
  ArrayIndex AVar5;
  Value *pVVar6;
  byte bVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  
  AVar4 = Value::size(value);
  bVar11 = this->rightMargin_ <= AVar4 * 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->childValues_,
                    (this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if (AVar4 != 0 && !bVar11) {
    uVar9 = 1;
    do {
      pVVar6 = Value::operator[](value,uVar9 - 1);
      if ((*(ushort *)&pVVar6->bits_ & 0xfe) == 6) {
        bVar2 = (byte)*(ushort *)&pVVar6->bits_;
        if ((7 < bVar2) || ((0xc1U >> (bVar2 & 0x1f) & 1) == 0)) {
          return true;
        }
        AVar5 = Value::size(pVVar6);
        bVar11 = AVar5 != 0;
      }
      else {
        bVar11 = false;
      }
    } while ((uVar9 < AVar4) && (uVar9 = uVar9 + 1, !bVar11));
  }
  bVar3 = true;
  if (!bVar11) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->childValues_,(ulong)AVar4);
    bVar2 = this->field_0xd8 | 1;
    this->field_0xd8 = bVar2;
    uVar9 = AVar4 * 2 + 2;
    if (AVar4 == 0) {
      bVar7 = 0;
    }
    else {
      lVar8 = 8;
      uVar10 = 0;
      bVar7 = 0;
      do {
        pVVar6 = Value::operator[](value,(ArrayIndex)uVar10);
        _Var1._M_head_impl =
             (pVVar6->comments_).ptr_._M_t.
             super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
             .
             super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
             ._M_head_impl;
        if ((_Var1._M_head_impl !=
             (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)0x0) &&
           (((*(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 8) != 0 ||
             (*(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 0x28) != 0)) ||
            (*(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 0x48) != 0)))) {
          bVar7 = 1;
        }
        pVVar6 = Value::operator[](value,(ArrayIndex)uVar10);
        writeValue(this,pVVar6);
        uVar9 = uVar9 + *(int *)((long)&(((this->childValues_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar8);
        uVar10 = uVar10 + 1;
        lVar8 = lVar8 + 0x20;
      } while (AVar4 != uVar10);
      bVar2 = this->field_0xd8;
    }
    this->field_0xd8 = bVar2 & 0xfe;
    bVar3 = (bool)(this->rightMargin_ <= uVar9 | bVar7);
  }
  return bVar3;
}

Assistant:

bool BuiltStyledStreamWriter::isMultilineArray(Value const& value) {
  ArrayIndex const size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (ArrayIndex index = 0; index < size && !isMultiLine; ++index) {
    Value const& childValue = value[index];
    isMultiLine = ((childValue.isArray() || childValue.isObject()) &&
                   !childValue.empty());
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    ArrayIndex lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (ArrayIndex index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += static_cast<ArrayIndex>(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}